

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
unique_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(unique_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_6)

{
  bool bVar1;
  int iVar2;
  walk_result wVar3;
  allocator<char> local_1a1;
  string local_1a0 [32];
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  validation_message local_148;
  
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (instance);
  if (!bVar1) {
    return advance;
  }
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&this_context,context,
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  .keyword_name_);
  if (((this->
       super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
       ).field_0xe0 == '\x01') && (bVar1 = array_has_unique_items(instance), !bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_1a0,"Array items are not unique",&local_1a1);
    (*(this->
      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).
      super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      .super_validation_message_factory._vptr_validation_message_factory[2])
              (&local_148,this,&this_context.eval_path_,instance_location,local_1a0);
    reporter->error_count_ = reporter->error_count_ + 1;
    iVar2 = (*reporter->_vptr_error_reporter[2])(reporter,&local_148);
    validation_message::~validation_message(&local_148);
    std::__cxx11::string::~string(local_1a0);
    if (iVar2 == 1) {
      wVar3 = abort;
      goto LAB_0039585a;
    }
  }
  wVar3 = advance;
LAB_0039585a:
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context(&this_context);
  return wVar3;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            if (!instance.is_array())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            if (are_unique_ && !array_has_unique_items(instance))
            {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    "Array items are not unique"));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }